

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  NodeRef *pNVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong unaff_R13;
  size_t mask;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  ulong local_14d8;
  undefined1 local_1498 [16];
  ulong local_1488;
  ulong local_1480;
  ulong local_1478;
  ulong local_1470;
  ulong local_1468;
  NodeRef *local_1460;
  Scene *local_1458;
  NodeRef *local_1450;
  RTCFilterFunctionNArguments args;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  undefined1 auVar34 [16];
  
  stack[0] = root;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar52 = ZEXT3264(auVar37);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar53 = ZEXT3264(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar54 = ZEXT3264(auVar39);
  auVar23 = vmulss_avx512f(auVar37._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar37._0_4_ = auVar23._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar37._16_4_ = auVar37._0_4_;
  auVar37._20_4_ = auVar37._0_4_;
  auVar37._24_4_ = auVar37._0_4_;
  auVar37._28_4_ = auVar37._0_4_;
  auVar23 = vmulss_avx512f(auVar38._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar38._0_4_ = auVar23._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar38._16_4_ = auVar38._0_4_;
  auVar38._20_4_ = auVar38._0_4_;
  auVar38._24_4_ = auVar38._0_4_;
  auVar38._28_4_ = auVar38._0_4_;
  auVar23 = vmulss_avx512f(auVar39._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar39._0_4_ = auVar23._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar39._16_4_ = auVar39._0_4_;
  auVar39._20_4_ = auVar39._0_4_;
  auVar39._24_4_ = auVar39._0_4_;
  auVar39._28_4_ = auVar39._0_4_;
  local_1468 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1470 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1478 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1480 = local_1468 ^ 0x20;
  local_1488 = local_1470 ^ 0x20;
  uVar17 = local_1478 ^ 0x20;
  auVar41._8_4_ = 0x80000000;
  auVar41._0_8_ = 0x8000000080000000;
  auVar41._12_4_ = 0x80000000;
  auVar41._16_4_ = 0x80000000;
  auVar41._20_4_ = 0x80000000;
  auVar41._24_4_ = 0x80000000;
  auVar41._28_4_ = 0x80000000;
  auVar37 = vxorps_avx512vl(auVar37,auVar41);
  auVar55 = ZEXT3264(auVar37);
  auVar37 = vxorps_avx512vl(auVar38,auVar41);
  auVar56 = ZEXT3264(auVar37);
  auVar37 = vxorps_avx512vl(auVar39,auVar41);
  auVar57 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar58 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar59 = ZEXT3264(auVar37);
  auVar23 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar60 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar61 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar62 = ZEXT1664(auVar23);
  auVar23 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar63 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar64 = ZEXT1664(auVar23);
  pNVar12 = stack + 1;
  do {
    local_1450 = pNVar12;
    if (local_1450 == stack) break;
    local_1460 = local_1450 + -1;
    sVar15 = local_1450[-1].ptr;
    do {
      if ((sVar15 & 8) == 0) {
        auVar37 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar15 + 0x40 + local_1468),auVar55._0_32_,
                             auVar52._0_32_);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar15 + 0x40 + local_1470),auVar56._0_32_,
                             auVar53._0_32_);
        auVar37 = vpmaxsd_avx2(auVar37,auVar38);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar15 + 0x40 + local_1478),auVar57._0_32_,
                             auVar54._0_32_);
        auVar38 = vpmaxsd_avx512vl(auVar38,auVar58._0_32_);
        auVar37 = vpmaxsd_avx2(auVar37,auVar38);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar15 + 0x40 + local_1480),auVar55._0_32_,
                             auVar52._0_32_);
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar15 + 0x40 + local_1488),auVar56._0_32_,
                             auVar53._0_32_);
        auVar38 = vpminsd_avx2(auVar38,auVar39);
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar15 + 0x40 + uVar17),auVar57._0_32_,
                             auVar54._0_32_);
        auVar39 = vpminsd_avx512vl(auVar39,auVar59._0_32_);
        auVar38 = vpminsd_avx2(auVar38,auVar39);
        uVar10 = vpcmpd_avx512vl(auVar37,auVar38,2);
        unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar10);
      }
      if ((sVar15 & 8) == 0) {
        if (unaff_R13 == 0) {
          uVar47 = 4;
        }
        else {
          uVar14 = sVar15 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar13 = unaff_R13; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          for (uVar13 = unaff_R13 - 1 & unaff_R13; sVar15 = *(size_t *)(uVar14 + lVar18 * 8),
              uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
            local_1460->ptr = sVar15;
            local_1460 = local_1460 + 1;
            lVar18 = 0;
            for (uVar16 = uVar13; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
          }
          uVar47 = 0;
        }
      }
      else {
        uVar47 = 6;
      }
    } while (uVar47 == 0);
    if (uVar47 == 6) {
      uVar13 = (ulong)((uint)sVar15 & 0xf);
      uVar47 = 0;
      uVar14 = uVar13 - 8;
      bVar19 = uVar13 != 8;
      if (bVar19) {
        uVar13 = sVar15 & 0xfffffffffffffff0;
        uVar16 = 0;
        do {
          lVar18 = uVar16 * 0xb0;
          auVar23 = *(undefined1 (*) [16])(uVar13 + 0x80 + lVar18);
          auVar36 = *(undefined1 (*) [16])(uVar13 + 0x40 + lVar18);
          auVar34 = *(undefined1 (*) [16])(uVar13 + 0x70 + lVar18);
          auVar33 = *(undefined1 (*) [16])(uVar13 + 0x50 + lVar18);
          auVar24._0_4_ = auVar36._0_4_ * auVar23._0_4_;
          auVar24._4_4_ = auVar36._4_4_ * auVar23._4_4_;
          auVar24._8_4_ = auVar36._8_4_ * auVar23._8_4_;
          auVar24._12_4_ = auVar36._12_4_ * auVar23._12_4_;
          auVar4 = *(undefined1 (*) [16])(uVar13 + 0x60 + lVar18);
          auVar45 = *(undefined1 (*) [16])(uVar13 + 0x30 + lVar18);
          local_1398 = vfmsub231ps_fma(auVar24,auVar34,auVar33);
          auVar28._0_4_ = auVar33._0_4_ * auVar4._0_4_;
          auVar28._4_4_ = auVar33._4_4_ * auVar4._4_4_;
          auVar28._8_4_ = auVar33._8_4_ * auVar4._8_4_;
          auVar28._12_4_ = auVar33._12_4_ * auVar4._12_4_;
          local_1388 = vfmsub231ps_fma(auVar28,auVar23,auVar45);
          auVar29._0_4_ = auVar45._0_4_ * auVar34._0_4_;
          auVar29._4_4_ = auVar45._4_4_ * auVar34._4_4_;
          auVar29._8_4_ = auVar45._8_4_ * auVar34._8_4_;
          auVar29._12_4_ = auVar45._12_4_ * auVar34._12_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          fVar40 = *(float *)(ray + k * 4 + 0x60);
          auVar30._4_4_ = fVar40;
          auVar30._0_4_ = fVar40;
          auVar30._8_4_ = fVar40;
          auVar30._12_4_ = fVar40;
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar27._4_4_ = uVar1;
          auVar27._0_4_ = uVar1;
          auVar27._8_4_ = uVar1;
          auVar27._12_4_ = uVar1;
          auVar24 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar13 + lVar18),auVar27);
          local_1378 = vfmsub231ps_fma(auVar29,auVar4,auVar36);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar25._4_4_ = uVar1;
          auVar25._0_4_ = uVar1;
          auVar25._8_4_ = uVar1;
          auVar25._12_4_ = uVar1;
          auVar25 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar13 + 0x10 + lVar18),auVar25);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar26._4_4_ = uVar1;
          auVar26._0_4_ = uVar1;
          auVar26._8_4_ = uVar1;
          auVar26._12_4_ = uVar1;
          auVar26 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar13 + 0x20 + lVar18),auVar26);
          auVar27 = vmulps_avx512vl(auVar32,auVar26);
          auVar28 = vfmsub231ps_avx512vl(auVar27,auVar25,auVar30);
          auVar27 = vmulps_avx512vl(auVar30,auVar24);
          auVar29 = vfmsub231ps_avx512vl(auVar27,auVar26,auVar31);
          auVar27 = vmulps_avx512vl(auVar31,auVar25);
          auVar30 = vfmsub231ps_avx512vl(auVar27,auVar24,auVar32);
          auVar51._0_4_ = fVar40 * local_1378._0_4_;
          auVar51._4_4_ = fVar40 * local_1378._4_4_;
          auVar51._8_4_ = fVar40 * local_1378._8_4_;
          auVar51._12_4_ = fVar40 * local_1378._12_4_;
          auVar27 = vfmadd231ps_fma(auVar51,local_1388,auVar32);
          auVar27 = vfmadd231ps_fma(auVar27,local_1398,auVar31);
          auVar31 = vandps_avx512vl(auVar27,auVar61._0_16_);
          auVar32 = vandps_avx512vl(auVar27,auVar62._0_16_);
          auVar23 = vmulps_avx512vl(auVar23,auVar30);
          auVar23 = vfmadd231ps_avx512vl(auVar23,auVar29,auVar34);
          auVar23 = vfmadd231ps_avx512vl(auVar23,auVar28,auVar4);
          uVar47 = auVar32._0_4_;
          auVar34._0_4_ = (float)(uVar47 ^ auVar23._0_4_);
          uVar48 = auVar32._4_4_;
          auVar34._4_4_ = (float)(uVar48 ^ auVar23._4_4_);
          uVar49 = auVar32._8_4_;
          auVar34._8_4_ = (float)(uVar49 ^ auVar23._8_4_);
          uVar50 = auVar32._12_4_;
          auVar34._12_4_ = (float)(uVar50 ^ auVar23._12_4_);
          auVar23 = vmulps_avx512vl(auVar33,auVar30);
          auVar23 = vfmadd231ps_avx512vl(auVar23,auVar36,auVar29);
          auVar23 = vfmadd231ps_avx512vl(auVar23,auVar45,auVar28);
          auVar36._0_4_ = (float)(uVar47 ^ auVar23._0_4_);
          auVar36._4_4_ = (float)(uVar48 ^ auVar23._4_4_);
          auVar36._8_4_ = (float)(uVar49 ^ auVar23._8_4_);
          auVar36._12_4_ = (float)(uVar50 ^ auVar23._12_4_);
          auVar23 = auVar63._0_16_;
          uVar10 = vcmpps_avx512vl(auVar34,auVar23,5);
          uVar7 = vcmpps_avx512vl(auVar36,auVar23,5);
          uVar8 = vcmpps_avx512vl(auVar27,auVar23,4);
          auVar23._0_4_ = auVar36._0_4_ + auVar34._0_4_;
          auVar23._4_4_ = auVar36._4_4_ + auVar34._4_4_;
          auVar23._8_4_ = auVar36._8_4_ + auVar34._8_4_;
          auVar23._12_4_ = auVar36._12_4_ + auVar34._12_4_;
          uVar9 = vcmpps_avx512vl(auVar23,auVar31,2);
          bVar21 = (byte)uVar10 & (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
          if (bVar21 != 0) {
            auVar46._0_4_ = local_1378._0_4_ * auVar26._0_4_;
            auVar46._4_4_ = local_1378._4_4_ * auVar26._4_4_;
            auVar46._8_4_ = local_1378._8_4_ * auVar26._8_4_;
            auVar46._12_4_ = local_1378._12_4_ * auVar26._12_4_;
            auVar23 = vfmadd213ps_fma(auVar25,local_1388,auVar46);
            auVar23 = vfmadd213ps_fma(auVar24,local_1398,auVar23);
            auVar45._0_4_ = (float)(uVar47 ^ auVar23._0_4_);
            auVar45._4_4_ = (float)(uVar48 ^ auVar23._4_4_);
            auVar45._8_4_ = (float)(uVar49 ^ auVar23._8_4_);
            auVar45._12_4_ = (float)(uVar50 ^ auVar23._12_4_);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar33._4_4_ = uVar1;
            auVar33._0_4_ = uVar1;
            auVar33._8_4_ = uVar1;
            auVar33._12_4_ = uVar1;
            auVar23 = vmulps_avx512vl(auVar31,auVar33);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar4._4_4_ = uVar1;
            auVar4._0_4_ = uVar1;
            auVar4._8_4_ = uVar1;
            auVar4._12_4_ = uVar1;
            auVar33 = vmulps_avx512vl(auVar31,auVar4);
            uVar10 = vcmpps_avx512vl(auVar45,auVar33,2);
            uVar7 = vcmpps_avx512vl(auVar23,auVar45,1);
            bVar21 = (byte)uVar10 & (byte)uVar7 & bVar21;
            if (bVar21 != 0) {
              local_1458 = context->scene;
              auVar23 = vrcp14ps_avx512vl(auVar31);
              auVar33 = vfnmadd213ps_avx512vl(auVar31,auVar23,auVar64._0_16_);
              auVar23 = vfmadd132ps_fma(auVar33,auVar23,auVar23);
              fVar40 = auVar23._0_4_;
              fVar42 = auVar23._4_4_;
              fVar43 = auVar23._8_4_;
              fVar44 = auVar23._12_4_;
              local_13a8[0] = fVar40 * auVar45._0_4_;
              local_13a8[1] = fVar42 * auVar45._4_4_;
              local_13a8[2] = fVar43 * auVar45._8_4_;
              local_13a8[3] = fVar44 * auVar45._12_4_;
              local_13c8[0] = fVar40 * auVar34._0_4_;
              local_13c8[1] = fVar42 * auVar34._4_4_;
              local_13c8[2] = fVar43 * auVar34._8_4_;
              local_13c8[3] = fVar44 * auVar34._12_4_;
              local_13b8._0_4_ = fVar40 * auVar36._0_4_;
              local_13b8._4_4_ = fVar42 * auVar36._4_4_;
              local_13b8._8_4_ = fVar43 * auVar36._8_4_;
              local_13b8._12_4_ = fVar44 * auVar36._12_4_;
              local_14d8 = (ulong)bVar21;
              do {
                auVar23 = auVar63._0_16_;
                uVar11 = 0;
                for (uVar22 = local_14d8; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  uVar11 = uVar11 + 1;
                }
                pGVar5 = (local_1458->geometries).items
                         [*(uint *)(lVar18 + uVar13 + 0x90 + uVar11 * 4)].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_14d8 = local_14d8 ^ 1L << (uVar11 & 0x3f);
                  bVar20 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar20 = false;
                }
                else {
                  local_12d8 = vmovdqu64_avx512vl(auVar59._0_32_);
                  local_12b8 = vmovdqu64_avx512vl(auVar58._0_32_);
                  local_1298 = auVar57._0_32_;
                  local_1278 = auVar56._0_32_;
                  local_1258 = auVar55._0_32_;
                  local_1238 = auVar54._0_32_;
                  local_1218 = auVar53._0_32_;
                  local_11f8 = auVar52._0_32_;
                  uVar22 = (ulong)(uint)((int)uVar11 * 4);
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar2 = *(undefined4 *)((long)local_13c8 + uVar22);
                  local_1338._4_4_ = uVar2;
                  local_1338._0_4_ = uVar2;
                  local_1338._8_4_ = uVar2;
                  local_1338._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_13b8 + uVar22);
                  local_1328._4_4_ = uVar2;
                  local_1328._0_4_ = uVar2;
                  local_1328._8_4_ = uVar2;
                  local_1328._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar22);
                  args.context = context->user;
                  local_1308 = vpbroadcastd_avx512vl();
                  uVar2 = *(undefined4 *)(lVar18 + uVar13 + 0xa0 + uVar22);
                  local_1318._4_4_ = uVar2;
                  local_1318._0_4_ = uVar2;
                  local_1318._8_4_ = uVar2;
                  local_1318._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1398 + uVar22);
                  uVar3 = *(undefined4 *)(local_1388 + uVar22);
                  local_1358._4_4_ = uVar3;
                  local_1358._0_4_ = uVar3;
                  local_1358._8_4_ = uVar3;
                  local_1358._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_1378 + uVar22);
                  local_1348._4_4_ = uVar3;
                  local_1348._0_4_ = uVar3;
                  local_1348._8_4_ = uVar3;
                  local_1348._12_4_ = uVar3;
                  local_1368[0] = (RTCHitN)(char)uVar2;
                  local_1368[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1368[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1368[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1368[4] = (RTCHitN)(char)uVar2;
                  local_1368[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1368[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1368[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1368[8] = (RTCHitN)(char)uVar2;
                  local_1368[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1368[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1368[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1368[0xc] = (RTCHitN)(char)uVar2;
                  local_1368[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1368[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1368[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                  uStack_12f4 = (args.context)->instID[0];
                  local_12f8 = uStack_12f4;
                  uStack_12f0 = uStack_12f4;
                  uStack_12ec = uStack_12f4;
                  uStack_12e8 = (args.context)->instPrimID[0];
                  uStack_12e4 = uStack_12e8;
                  uStack_12e0 = uStack_12e8;
                  uStack_12dc = uStack_12e8;
                  auVar36 = vmovdqa64_avx512vl(auVar60._0_16_);
                  local_1498 = vmovdqa64_avx512vl(auVar60._0_16_);
                  args.valid = (int *)local_1498;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.hit = local_1368;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&args);
                  }
                  uVar22 = vptestmd_avx512vl(local_1498,local_1498);
                  if ((uVar22 & 0xf) == 0) {
                    bVar20 = true;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&args);
                    }
                    uVar22 = vptestmd_avx512vl(local_1498,local_1498);
                    uVar22 = uVar22 & 0xf;
                    auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar20 = (bool)((byte)uVar22 & 1);
                    auVar35._0_4_ =
                         (uint)bVar20 * auVar34._0_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x80);
                    bVar20 = (bool)((byte)(uVar22 >> 1) & 1);
                    auVar35._4_4_ =
                         (uint)bVar20 * auVar34._4_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x84);
                    bVar20 = (bool)((byte)(uVar22 >> 2) & 1);
                    auVar35._8_4_ =
                         (uint)bVar20 * auVar34._8_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x88);
                    bVar20 = SUB81(uVar22 >> 3,0);
                    auVar35._12_4_ =
                         (uint)bVar20 * auVar34._12_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x8c);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar35;
                    bVar20 = (byte)uVar22 == 0;
                  }
                  if (bVar20) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                    local_14d8 = local_14d8 ^ 1L << (uVar11 & 0x3f);
                  }
                  auVar52 = ZEXT3264(local_11f8);
                  auVar53 = ZEXT3264(local_1218);
                  auVar54 = ZEXT3264(local_1238);
                  auVar55 = ZEXT3264(local_1258);
                  auVar56 = ZEXT3264(local_1278);
                  auVar57 = ZEXT3264(local_1298);
                  auVar37 = vmovdqu64_avx512vl(local_12b8);
                  auVar58 = ZEXT3264(auVar37);
                  auVar37 = vmovdqu64_avx512vl(local_12d8);
                  auVar59 = ZEXT3264(auVar37);
                  auVar36 = vmovdqa64_avx512vl(auVar36);
                  auVar60 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar61 = ZEXT1664(auVar36);
                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar62 = ZEXT1664(auVar36);
                  auVar23 = vxorps_avx512vl(auVar23,auVar23);
                  auVar63 = ZEXT1664(auVar23);
                  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar64 = ZEXT1664(auVar23);
                }
                if (!bVar20) {
                  uVar47 = 0;
                  if (bVar19) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar47 = 1;
                  }
                  goto LAB_0082f5de;
                }
              } while (local_14d8 != 0);
            }
          }
          uVar47 = 0;
          uVar16 = uVar16 + 1;
          bVar19 = uVar16 < uVar14;
        } while (uVar16 != uVar14);
      }
    }
LAB_0082f5de:
    pNVar12 = local_1460;
  } while ((uVar47 & 3) == 0);
  return local_1450 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }